

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Segment::PreloadCluster(Segment *this,Cluster *pCluster,ptrdiff_t idx)

{
  undefined1 auVar1 [16];
  long *plVar2;
  ulong uVar3;
  Cluster **ppCVar4;
  Cluster **ppCVar5;
  long lVar6;
  ulong local_88;
  Cluster **qq_1;
  Cluster **q;
  Cluster **p;
  Cluster **pp;
  Cluster **p_1;
  Cluster **q_1;
  Cluster **qq;
  long n;
  long *size;
  long count;
  ptrdiff_t idx_local;
  Cluster *pCluster_local;
  Segment *this_local;
  
  if (((pCluster == (Cluster *)0x0) || (-1 < pCluster->m_index)) || (idx < this->m_clusterCount)) {
    this_local._7_1_ = false;
  }
  else {
    lVar6 = this->m_clusterCount + this->m_clusterPreloadCount;
    plVar2 = &this->m_clusterSize;
    if (*plVar2 < lVar6) {
      this_local._7_1_ = false;
    }
    else {
      if (*plVar2 <= lVar6) {
        if (*plVar2 < 1) {
          local_88 = 0x800;
        }
        else {
          local_88 = *plVar2 << 1;
        }
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_88;
        uVar3 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar3 = 0xffffffffffffffff;
        }
        ppCVar4 = (Cluster **)operator_new__(uVar3,(nothrow_t *)&std::nothrow);
        if (ppCVar4 == (Cluster **)0x0) {
          return false;
        }
        ppCVar5 = this->m_clusters;
        pp = ppCVar5;
        p_1 = ppCVar4;
        while (pp != ppCVar5 + lVar6) {
          *p_1 = *pp;
          pp = pp + 1;
          p_1 = p_1 + 1;
        }
        if (this->m_clusters != (Cluster **)0x0) {
          operator_delete__(this->m_clusters);
        }
        this->m_clusters = ppCVar4;
        *plVar2 = local_88;
      }
      if (this->m_clusters == (Cluster **)0x0) {
        this_local._7_1_ = false;
      }
      else {
        ppCVar4 = this->m_clusters;
        qq_1 = this->m_clusters + lVar6;
        if ((qq_1 < ppCVar4 + idx) || (this->m_clusters + *plVar2 <= qq_1)) {
          this_local._7_1_ = false;
        }
        else {
          while (ppCVar4 + idx < qq_1) {
            ppCVar5 = qq_1 + -1;
            if (-1 < (*ppCVar5)->m_index) {
              return false;
            }
            *qq_1 = *ppCVar5;
            qq_1 = ppCVar5;
          }
          this->m_clusters[idx] = pCluster;
          this->m_clusterPreloadCount = this->m_clusterPreloadCount + 1;
          this_local._7_1_ = true;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Segment::PreloadCluster(Cluster* pCluster, ptrdiff_t idx) {
  if (pCluster == NULL || pCluster->m_index >= 0 || idx < m_clusterCount)
    return false;

  const long count = m_clusterCount + m_clusterPreloadCount;

  long& size = m_clusterSize;
  if (size < count)
    return false;

  if (count >= size) {
    const long n = (size <= 0) ? 2048 : 2 * size;

    Cluster** const qq = new (std::nothrow) Cluster*[n];
    if (qq == NULL)
      return false;
    Cluster** q = qq;

    Cluster** p = m_clusters;
    Cluster** const pp = p + count;

    while (p != pp)
      *q++ = *p++;

    delete[] m_clusters;

    m_clusters = qq;
    size = n;
  }

  if (m_clusters == NULL)
    return false;

  Cluster** const p = m_clusters + idx;

  Cluster** q = m_clusters + count;
  if (q < p || q >= (m_clusters + size))
    return false;

  while (q > p) {
    Cluster** const qq = q - 1;

    if ((*qq)->m_index >= 0)
      return false;

    *q = *qq;
    q = qq;
  }

  m_clusters[idx] = pCluster;
  ++m_clusterPreloadCount;
  return true;
}